

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrcase.cpp
# Opt level: O3

int32_t icu_63::anon_unknown_10::appendResult
                  (UChar *dest,int32_t destIndex,int32_t destCapacity,int32_t result,UChar *s,
                  int32_t cpLength,uint32_t options,Edits *edits)

{
  int iVar1;
  int32_t iVar2;
  long lVar3;
  uint uVar4;
  
  if (result < 0) {
    if (edits != (Edits *)0x0) {
      Edits::addUnchanged(edits,cpLength);
    }
    if ((options >> 0xe & 1) != 0) {
      return destIndex;
    }
    uVar4 = ~result;
    iVar2 = cpLength;
    if (0xfffeffff < (uint)result && destIndex < destCapacity) {
      dest[destIndex] = (UChar)uVar4;
      return destIndex + 1;
    }
  }
  else {
    iVar2 = result;
    uVar4 = 0xffffffff;
    if (0x1f < (uint)result) {
      if ((uint)result < 0x10000 && destIndex < destCapacity) {
        dest[destIndex] = (UChar)result;
        if (edits == (Edits *)0x0) {
          return destIndex + 1;
        }
        Edits::addReplace(edits,cpLength,1);
        return destIndex + 1;
      }
      iVar2 = 2 - (uint)((uint)result < 0x10000);
      uVar4 = result;
    }
    if (edits != (Edits *)0x0) {
      Edits::addReplace(edits,cpLength,iVar2);
    }
  }
  if ((int)(destIndex ^ 0x7fffffffU) < iVar2) {
    return -1;
  }
  if (destIndex < destCapacity) {
    if ((int)uVar4 < 0) {
      if (destCapacity < iVar2 + destIndex) {
        return iVar2 + destIndex;
      }
      if (iVar2 < 1) {
        return destIndex;
      }
      uVar4 = iVar2 + 1;
      lVar3 = 0;
      do {
        dest[destIndex + lVar3] = s[lVar3];
        lVar3 = lVar3 + 1;
        uVar4 = uVar4 - 1;
      } while (1 < uVar4);
      return destIndex + (int)lVar3;
    }
    if (uVar4 < 0x10000) {
      iVar2 = destIndex + 1;
      iVar1 = destIndex;
    }
    else {
      if ((0x10ffff < uVar4) || (iVar1 = destIndex + 1, destCapacity <= iVar1)) goto LAB_002cc7b9;
      dest[destIndex] = (short)(uVar4 >> 10) + L'ퟀ';
      uVar4 = uVar4 & 0x3ff | 0xdc00;
      iVar2 = destIndex + 2;
    }
    dest[iVar1] = (UChar)uVar4;
  }
  else {
LAB_002cc7b9:
    iVar2 = iVar2 + destIndex;
  }
  return iVar2;
}

Assistant:

inline int32_t
appendResult(UChar *dest, int32_t destIndex, int32_t destCapacity,
             int32_t result, const UChar *s,
             int32_t cpLength, uint32_t options, icu::Edits *edits) {
    UChar32 c;
    int32_t length;

    /* decode the result */
    if(result<0) {
        /* (not) original code point */
        if(edits!=NULL) {
            edits->addUnchanged(cpLength);
        }
        if(options & U_OMIT_UNCHANGED_TEXT) {
            return destIndex;
        }
        c=~result;
        if(destIndex<destCapacity && c<=0xffff) {  // BMP slightly-fastpath
            dest[destIndex++]=(UChar)c;
            return destIndex;
        }
        length=cpLength;
    } else {
        if(result<=UCASE_MAX_STRING_LENGTH) {
            c=U_SENTINEL;
            length=result;
        } else if(destIndex<destCapacity && result<=0xffff) {  // BMP slightly-fastpath
            dest[destIndex++]=(UChar)result;
            if(edits!=NULL) {
                edits->addReplace(cpLength, 1);
            }
            return destIndex;
        } else {
            c=result;
            length=U16_LENGTH(c);
        }
        if(edits!=NULL) {
            edits->addReplace(cpLength, length);
        }
    }
    if(length>(INT32_MAX-destIndex)) {
        return -1;  // integer overflow
    }

    if(destIndex<destCapacity) {
        /* append the result */
        if(c>=0) {
            /* code point */
            UBool isError=FALSE;
            U16_APPEND(dest, destIndex, destCapacity, c, isError);
            if(isError) {
                /* overflow, nothing written */
                destIndex+=length;
            }
        } else {
            /* string */
            if((destIndex+length)<=destCapacity) {
                while(length>0) {
                    dest[destIndex++]=*s++;
                    --length;
                }
            } else {
                /* overflow */
                destIndex+=length;
            }
        }
    } else {
        /* preflight */
        destIndex+=length;
    }
    return destIndex;
}